

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall Logger::Logger(Logger *this)

{
  Logger *this_local;
  
  this->l_buf = (char *)0x0;
  this->l_inited = false;
  this->l_buffer_queue =
       (buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  this->l_is_stdout = false;
  std::atomic<bool>::atomic(&this->is_thread_stop,false);
  std::mutex::mutex(&this->l_mutex);
  this->l_asyncw_thread = (thread *)0x0;
  if (2 < pr_level) {
    printf("[%-5s][%s:%d] log class constructed\n","debug","Logger",0x29);
  }
  this->l_count = 0;
  return;
}

Assistant:

Logger::Logger()
{
    PR_DEBUG("log class constructed\n");
    l_count = 0;
}